

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaPValAttrQName
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaBasicItemPtr ownerItem,
              xmlNodePtr ownerElem,char *name,xmlChar **uri,xmlChar **local)

{
  int iVar1;
  xmlNodePtr node;
  xmlAttrPtr attr;
  
  node = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)ownerItem,(char *)ownerElem);
  if (node != (xmlNodePtr)0x0) {
    attr = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt,node);
    iVar1 = xmlSchemaPValAttrNodeQNameValue
                      (ctxt,schema,(xmlSchemaBasicItemPtr)node,attr,(xmlChar *)name,uri,local);
    return iVar1;
  }
  *uri = (xmlChar *)0x0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  return 0;
}

Assistant:

static int
xmlSchemaPValAttrQName(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlSchemaBasicItemPtr ownerItem,
				   xmlNodePtr ownerElem,
				   const char *name,
				   const xmlChar **uri,
				   const xmlChar **local)
{
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(ownerElem, name);
    if (attr == NULL) {
	*local = NULL;
	*uri = NULL;
	return (0);
    }
    return (xmlSchemaPValAttrNodeQName(ctxt, schema,
	ownerItem, attr, uri, local));
}